

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuaranteedThroughputProbabilisticSampler.h
# Opt level: O3

SamplingStatus * __thiscall
jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::isSampled
          (SamplingStatus *__return_storage_ptr__,GuaranteedThroughputProbabilisticSampler *this,
          TraceID *id,string *operation)

{
  RateLimitingSampler *pRVar1;
  SamplingStatus samplingStatus;
  bool local_90 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_88;
  undefined1 local_70 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_68;
  bool local_50;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_48;
  
  local_50 = id->_low <= (this->_probabilisticSampler)._samplingBoundary;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            (&local_48,&(this->_probabilisticSampler)._tags);
  if (local_50 == true) {
    pRVar1 = (this->_lowerBoundSampler)._M_t.
             super___uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             .super__Head_base<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_false>.
             _M_head_impl;
    (*(pRVar1->super_Sampler)._vptr_Sampler[2])(local_70,pRVar1,id,operation);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_68);
    __return_storage_ptr__->_isSampled = local_50;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
              (&__return_storage_ptr__->_tags,&local_48);
  }
  else {
    pRVar1 = (this->_lowerBoundSampler)._M_t.
             super___uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             .super__Head_base<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_false>.
             _M_head_impl;
    (*(pRVar1->super_Sampler)._vptr_Sampler[2])(local_90,pRVar1,id,operation);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_88);
    __return_storage_ptr__->_isSampled = local_90[0];
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
              (&__return_storage_ptr__->_tags,&this->_tags);
  }
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

SamplingStatus isSampled(const TraceID& id,
                             const std::string& operation) override
    {
        const auto samplingStatus =
            _probabilisticSampler.isSampled(id, operation);
        if (samplingStatus.isSampled()) {
            _lowerBoundSampler->isSampled(id, operation);
            return samplingStatus;
        }
        const auto sampled =
            _lowerBoundSampler->isSampled(id, operation).isSampled();
        return SamplingStatus(sampled, _tags);
    }